

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  int *piVar1;
  ImGuiViewportP *pIVar2;
  ImGuiWindow *window_00;
  ImGuiWindow **ppIVar3;
  ImVector<ImGuiWindow_*> *this;
  int i;
  int i_00;
  
  pIVar2 = window->Viewport;
  piVar1 = &(GImGui->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  if ((window->Flags & 0x20000000) != 0) {
    ImDrawList::ChannelsMerge(window->DrawList);
  }
  AddDrawListToDrawData((pIVar2->DrawDataBuilder).Layers + (uint)layer,window->DrawList);
  this = &(window->DC).ChildWindows;
  for (i_00 = 0; i_00 < this->Size; i_00 = i_00 + 1) {
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    window_00 = *ppIVar3;
    if ((window_00->Active == true) && (window_00->Hidden == false)) {
      AddWindowToDrawData(window_00,layer);
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = window->Viewport;
    g.IO.MetricsRenderWindows++;
    if (window->Flags & ImGuiWindowFlags_DockNodeHost)
        window->DrawList->ChannelsMerge();
    AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
    }
}